

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool __thiscall TestETCaptureCoverageInternal::Run(TestETCaptureCoverageInternal *this)

{
  Outputter *pOVar1;
  bool bVar2;
  int *t;
  Capture<testinator::OpPair<testinator::Nothing,_testinator::SecondOp,_bool>_> *pCVar3;
  bool *pbVar4;
  int *in_RDX;
  int *tail;
  int *tail_00;
  char (*s) [104];
  bool *tail_01;
  char (*s_00) [104];
  Cons<std::pair<std::pair<std::pair<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>,_const_char_*>,_testinator::stringifier_select<bool,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>,_const_char_*>_>
  local_348;
  testinator local_318 [39];
  stringifier_select<bool,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>
  local_2f1;
  int local_2f0;
  undefined1 local_2e9 [9];
  Cons<std::pair<testinator::Nil,_const_char_*>_> *local_2e0;
  Cons<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>_> local_2d8;
  Cons<std::pair<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>,_const_char_*>_> local_2c0
  ;
  undefined1 local_2a0 [8];
  Cons<std::pair<std::pair<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>,_const_char_*>,_testinator::stringifier_select<bool,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>_>
  diag_1;
  Capture<testinator::OpPair<testinator::Nothing,_testinator::SecondOp,_bool>_> cap_1;
  stringifier_select<int,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>
  local_268;
  char *local_260;
  Cons<std::pair<std::pair<std::pair<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>,_const_char_*>,_testinator::stringifier_select<int,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>,_const_char_*>_>
  local_258;
  Cons<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>,_const_char_*>,_testinator::stringifier_select<int,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>,_const_char_*>,_const_char_*>_>
  local_228;
  Cons<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>,_const_char_*>,_testinator::stringifier_select<int,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>,_const_char_*>,_const_char_*>,_const_char_*>_>
  local_1f0;
  Cons<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>,_const_char_*>,_testinator::stringifier_select<int,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>,_const_char_*>,_const_char_*>,_const_char_*>,_testinator::stringifier_select<int,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>_>
  local_1b0;
  Cons<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>,_const_char_*>,_testinator::stringifier_select<int,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>,_const_char_*>,_const_char_*>,_const_char_*>,_testinator::stringifier_select<int,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>,_const_char_*>_>
  local_168;
  testinator local_118 [36];
  int local_f4;
  stringifier_select<int,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>
  local_f0;
  int local_e8;
  undefined1 local_e1 [9];
  Cons<std::pair<testinator::Nil,_const_char_*>_> *local_d8;
  Cons<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>_> local_d0;
  Cons<std::pair<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>,_const_char_*>_> local_b8;
  undefined1 local_98 [8];
  Cons<std::pair<std::pair<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>,_const_char_*>,_testinator::stringifier_select<int,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>_>
  diag;
  undefined8 local_54;
  undefined1 local_49;
  undefined1 local_48 [8];
  undefined1 local_40 [12];
  Capture<testinator::OpPair<testinator::OpPair<testinator::OpPair<testinator::Nothing,_testinator::SecondOp,_int>,_testinator::AddOp,_int>,_testinator::GTOp,_int>_>
  local_34;
  undefined1 local_24 [8];
  Capture<testinator::OpPair<testinator::OpPair<testinator::OpPair<testinator::OpPair<testinator::Nothing,_testinator::SecondOp,_int>,_testinator::AddOp,_int>,_testinator::GTOp,_int>,_testinator::LTOp,_int>_>
  cap;
  TestETCaptureCoverageInternal *this_local;
  
  local_49 = 0;
  local_54._4_4_ = 1;
  cap.m_list.m_pair._12_8_ = this;
  local_48 = (undefined1  [8])
             testinator::operator->*
                       ((Capture<testinator::OpPair<testinator::Nothing,_testinator::SecondOp,_int>_>
                         *)&local_49,(Capture<testinator::Nothing> *)((long)&local_54 + 4),in_RDX);
  local_54._0_4_ = 2;
  local_40._0_8_ =
       testinator::operator+
                 ((Capture<testinator::OpPair<testinator::OpPair<testinator::Nothing,_testinator::SecondOp,_int>,_testinator::AddOp,_int>_>
                   *)local_48,
                  (Capture<testinator::OpPair<testinator::Nothing,_testinator::SecondOp,_int>_> *)
                  &local_54,tail);
  local_40._8_4_ = SUB84(tail_00,0);
  diag.m_list.second.m_t._4_4_ = 4;
  local_34.m_list.m_pair.first.m_pair.first.m_pair =
       (pair<testinator::Nothing,_int>)
       testinator::operator>
                 ((Capture<testinator::OpPair<testinator::OpPair<testinator::OpPair<testinator::Nothing,_testinator::SecondOp,_int>,_testinator::AddOp,_int>,_testinator::GTOp,_int>_>
                   *)local_40,
                  (Capture<testinator::OpPair<testinator::OpPair<testinator::Nothing,_testinator::SecondOp,_int>,_testinator::AddOp,_int>_>
                   *)((long)&diag.m_list.second.m_t + 4),tail_00);
  diag.m_list.second.m_t._0_4_ = 0;
  testinator::operator<
            ((Capture<testinator::OpPair<testinator::OpPair<testinator::OpPair<testinator::OpPair<testinator::Nothing,_testinator::SecondOp,_int>,_testinator::AddOp,_int>,_testinator::GTOp,_int>,_testinator::LTOp,_int>_>
              *)local_24,&local_34,(int *)&diag.m_list.second);
  bVar2 = testinator::
          Eval<testinator::Capture<testinator::OpPair<testinator::OpPair<testinator::OpPair<testinator::OpPair<testinator::Nothing,testinator::SecondOp,int>,testinator::AddOp,int>,testinator::GTOp,int>,testinator::LTOp,int>>&>
                    ((Capture<testinator::OpPair<testinator::OpPair<testinator::OpPair<testinator::OpPair<testinator::Nothing,_testinator::SecondOp,_int>,_testinator::AddOp,_int>,_testinator::GTOp,_int>,_testinator::LTOp,_int>_>
                      *)local_24);
  if (!bVar2) {
    local_e1[0] = 0;
    local_d8 = testinator::operator<<
                         ((Cons<std::pair<testinator::Nil,_const_char_*>_> *)local_e1,
                          (Cons<testinator::Nil> *)
                          "EXPECT FAILED: /workspace/llm4binary/github/license_c_cmakelists/elbeno[P]testinator/src/test/main.cpp:"
                          ,s);
    local_e8 = 0x2a8;
    testinator::operator<<
              (&local_d0,(Cons<std::pair<testinator::Nil,_const_char_*>_> *)(local_e1 + 1),&local_e8
              );
    testinator::operator<<(&local_b8,&local_d0,(char (*) [20])" (1+2 > 1+3 < 0 => ");
    local_f4 = testinator::
               LHS<testinator::Capture<testinator::OpPair<testinator::OpPair<testinator::OpPair<testinator::OpPair<testinator::Nothing,testinator::SecondOp,int>,testinator::AddOp,int>,testinator::GTOp,int>,testinator::LTOp,int>>&>
                         ((Capture<testinator::OpPair<testinator::OpPair<testinator::OpPair<testinator::OpPair<testinator::Nothing,_testinator::SecondOp,_int>,_testinator::AddOp,_int>,_testinator::GTOp,_int>,_testinator::LTOp,_int>_>
                           *)local_24);
    local_f0.m_t = (int *)testinator::prettyprint<int>(&local_f4);
    testinator::operator<<
              ((Cons<std::pair<std::pair<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>,_const_char_*>,_testinator::stringifier_select<int,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>_>
                *)local_98,&local_b8,&local_f0);
    pOVar1 = (this->super_Test).m_op;
    testinator::operator<<
              (&local_258,
               (Cons<std::pair<std::pair<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>,_const_char_*>,_testinator::stringifier_select<int,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>_>
                *)local_98,(char (*) [2])0x274595);
    local_260 = testinator::
                RelOp<testinator::Capture<testinator::OpPair<testinator::OpPair<testinator::OpPair<testinator::OpPair<testinator::Nothing,testinator::SecondOp,int>,testinator::AddOp,int>,testinator::GTOp,int>,testinator::LTOp,int>>&>
                          ((Capture<testinator::OpPair<testinator::OpPair<testinator::OpPair<testinator::OpPair<testinator::Nothing,_testinator::SecondOp,_int>,_testinator::AddOp,_int>,_testinator::GTOp,_int>,_testinator::LTOp,_int>_>
                            *)local_24);
    testinator::operator<<(&local_228,&local_258,&local_260);
    testinator::operator<<(&local_1f0,&local_228,(char (*) [2])0x274595);
    t = testinator::
        RHS<testinator::Capture<testinator::OpPair<testinator::OpPair<testinator::OpPair<testinator::OpPair<testinator::Nothing,testinator::SecondOp,int>,testinator::AddOp,int>,testinator::GTOp,int>,testinator::LTOp,int>>&>
                  ((Capture<testinator::OpPair<testinator::OpPair<testinator::OpPair<testinator::OpPair<testinator::Nothing,_testinator::SecondOp,_int>,_testinator::AddOp,_int>,_testinator::GTOp,_int>,_testinator::LTOp,_int>_>
                    *)local_24);
    local_268.m_t = (int *)testinator::prettyprint<int>(t);
    testinator::operator<<(&local_1b0,&local_1f0,&local_268);
    testinator::operator<<(&local_168,&local_1b0,(char (*) [2])0x275bda);
    testinator::
    Diagnostic<testinator::Cons<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<testinator::Nil,char_const*>,int>,char_const*>,testinator::stringifier_select<int,testinator::default_formatter,testinator::detail::is_outputtable_tag>>,char_const*>,char_const*>,char_const*>,testinator::stringifier_select<int,testinator::default_formatter,testinator::detail::is_outputtable_tag>>,char_const*>>>
              (local_118,&local_168);
    (*pOVar1->_vptr_Outputter[3])();
    std::__cxx11::string::~string((string *)local_118);
    (this->super_Test).m_success = false;
  }
  memset(&diag_1.m_list.field_0x21,0,1);
  diag_1.m_list.second.m_t = false;
  pCVar3 = testinator::operator->*
                     ((Capture<testinator::OpPair<testinator::Nothing,_testinator::SecondOp,_bool>_>
                       *)&diag_1.m_list.field_0x21,
                      (Capture<testinator::Nothing> *)&diag_1.m_list.second,tail_01);
  diag_1.m_list._34_2_ = SUB82(pCVar3,0);
  pbVar4 = testinator::
           Eval<testinator::Capture<testinator::OpPair<testinator::Nothing,testinator::SecondOp,bool>>&>
                     ((Capture<testinator::OpPair<testinator::Nothing,_testinator::SecondOp,_bool>_>
                       *)&diag_1.m_list.field_0x22);
  if ((*pbVar4 & 1U) == 0) {
    local_2e9[0] = 0;
    local_2e0 = testinator::operator<<
                          ((Cons<std::pair<testinator::Nil,_const_char_*>_> *)local_2e9,
                           (Cons<testinator::Nil> *)
                           "EXPECT FAILED: /workspace/llm4binary/github/license_c_cmakelists/elbeno[P]testinator/src/test/main.cpp:"
                           ,s_00);
    local_2f0 = 0x2a9;
    testinator::operator<<
              (&local_2d8,(Cons<std::pair<testinator::Nil,_const_char_*>_> *)(local_2e9 + 1),
               &local_2f0);
    testinator::operator<<(&local_2c0,&local_2d8,(char (*) [12])" (false => ");
    pbVar4 = testinator::
             LHS<testinator::Capture<testinator::OpPair<testinator::Nothing,testinator::SecondOp,bool>>&>
                       ((Capture<testinator::OpPair<testinator::Nothing,_testinator::SecondOp,_bool>_>
                         *)&diag_1.m_list.field_0x22);
    local_2f1.m_t = (bool)testinator::prettyprint<bool>(pbVar4);
    testinator::operator<<
              ((Cons<std::pair<std::pair<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>,_const_char_*>,_testinator::stringifier_select<bool,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>_>
                *)local_2a0,&local_2c0,&local_2f1);
    pOVar1 = (this->super_Test).m_op;
    testinator::operator<<
              (&local_348,
               (Cons<std::pair<std::pair<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>,_const_char_*>,_testinator::stringifier_select<bool,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>_>
                *)local_2a0,(char (*) [2])0x275bda);
    testinator::
    Diagnostic<testinator::Cons<std::pair<std::pair<std::pair<std::pair<std::pair<testinator::Nil,char_const*>,int>,char_const*>,testinator::stringifier_select<bool,testinator::default_formatter,testinator::detail::is_outputtable_tag>>,char_const*>>>
              (local_318,&local_348);
    (*pOVar1->_vptr_Outputter[3])(pOVar1,local_318);
    std::__cxx11::string::~string((string *)local_318);
    (this->super_Test).m_success = false;
  }
  return true;
}

Assistant:

virtual bool Run()
  {
    EXPECT(1+2 > 1+3 < 0);
    EXPECT(false);
    return true;
  }